

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SupportVectorClassifier::MergeFrom
          (SupportVectorClassifier *this,SupportVectorClassifier *from)

{
  void *pvVar1;
  LogMessage *other;
  Kernel *this_00;
  SparseSupportVectors *this_01;
  SparseSupportVectors *from_00;
  DenseSupportVectors *this_02;
  DenseSupportVectors *from_01;
  StringVector *this_03;
  StringVector *from_02;
  Int64Vector *this_04;
  Int64Vector *from_03;
  Kernel *from_04;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/SVM.pb.cc"
               ,0xfa5);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            (&this->numberofsupportvectorsperclass_,&from->numberofsupportvectorsperclass_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
            (&(this->coefficients_).super_RepeatedPtrFieldBase,
             &(from->coefficients_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<double>::MergeFrom(&this->rho_,&from->rho_);
  google::protobuf::RepeatedField<double>::MergeFrom(&this->proba_,&from->proba_);
  google::protobuf::RepeatedField<double>::MergeFrom(&this->probb_,&from->probb_);
  if ((from != (SupportVectorClassifier *)&_SupportVectorClassifier_default_instance_) &&
     (from->kernel_ != (Kernel *)0x0)) {
    this_00 = mutable_kernel(this);
    from_04 = from->kernel_;
    if (from_04 == (Kernel *)0x0) {
      from_04 = (Kernel *)&_Kernel_default_instance_;
    }
    Kernel::MergeFrom(this_00,from_04);
  }
  if (from->_oneof_case_[0] == 4) {
    this_02 = mutable_densesupportvectors(this);
    from_01 = densesupportvectors(from);
    DenseSupportVectors::MergeFrom(this_02,from_01);
  }
  else if (from->_oneof_case_[0] == 3) {
    this_01 = mutable_sparsesupportvectors(this);
    from_00 = sparsesupportvectors(from);
    SparseSupportVectors::MergeFrom(this_01,from_00);
  }
  if (from->_oneof_case_[1] == 0x65) {
    this_04 = mutable_int64classlabels(this);
    from_03 = int64classlabels(from);
    Int64Vector::MergeFrom(this_04,from_03);
  }
  else if (from->_oneof_case_[1] == 100) {
    this_03 = mutable_stringclasslabels(this);
    from_02 = stringclasslabels(from);
    StringVector::MergeFrom(this_03,from_02);
  }
  return;
}

Assistant:

void SupportVectorClassifier::MergeFrom(const SupportVectorClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SupportVectorClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  numberofsupportvectorsperclass_.MergeFrom(from.numberofsupportvectorsperclass_);
  coefficients_.MergeFrom(from.coefficients_);
  rho_.MergeFrom(from.rho_);
  proba_.MergeFrom(from.proba_);
  probb_.MergeFrom(from.probb_);
  if (from.has_kernel()) {
    mutable_kernel()->::CoreML::Specification::Kernel::MergeFrom(from.kernel());
  }
  switch (from.supportVectors_case()) {
    case kSparseSupportVectors: {
      mutable_sparsesupportvectors()->::CoreML::Specification::SparseSupportVectors::MergeFrom(from.sparsesupportvectors());
      break;
    }
    case kDenseSupportVectors: {
      mutable_densesupportvectors()->::CoreML::Specification::DenseSupportVectors::MergeFrom(from.densesupportvectors());
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
}